

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_gmatch(lua_State *L)

{
  lj_lib_checkstr(L,1);
  lj_lib_checkstr(L,2);
  L->top = L->base + 3;
  L->base[2].u64 = 0;
  lj_lib_pushcc(L,lj_cf_string_gmatch_aux,0x69,3);
  return 1;
}

Assistant:

LJLIB_CF(string_gmatch)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkstr(L, 2);
  L->top = L->base+3;
  (L->top-1)->u64 = 0;
  lj_lib_pushcc(L, lj_cf_string_gmatch_aux, FF_string_gmatch_aux, 3);
  return 1;
}